

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::array<double,_3UL>_> * __thiscall
tinyusdz::Attribute::get_value<std::array<double,3ul>>
          (optional<std::array<double,_3UL>_> *__return_storage_ptr__,Attribute *this)

{
  optional<std::array<double,_3UL>_> local_38;
  Attribute *local_18;
  Attribute *this_local;
  
  local_18 = this;
  this_local = (Attribute *)__return_storage_ptr__;
  primvar::PrimVar::get_value<std::array<double,3ul>>(&local_38,&this->_var);
  nonstd::optional_lite::optional<std::array<double,_3UL>_>::optional<std::array<double,_3UL>,_0>
            (__return_storage_ptr__,&local_38);
  nonstd::optional_lite::optional<std::array<double,_3UL>_>::~optional(&local_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }